

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int validate_pattern(ly_ctx *ctx,char *val_str,lys_type *type,lyd_node *node)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  void **ppvVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((ctx == (ly_ctx *)0x0) || (type->base != LY_TYPE_STRING)) {
    __assert_fail("ctx && (type->base == LY_TYPE_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x263,
                  "int validate_pattern(struct ly_ctx *, const char *, struct lys_type *, struct lyd_node *)"
                 );
  }
  pcVar4 = "";
  if (val_str != (char *)0x0) {
    pcVar4 = val_str;
  }
  if ((type->der != (lys_tpdf *)0x0) &&
     (iVar3 = validate_pattern(ctx,pcVar4,&type->der->type,node), iVar3 != 0)) {
    return 1;
  }
  if (((type->info).str.patterns_pcre == (void **)0x0) &&
     (uVar8 = (type->info).str.pat_count, uVar8 != 0)) {
    ppvVar6 = (void **)malloc((ulong)(uVar8 * 2) << 3);
    (type->info).str.patterns_pcre = ppvVar6;
    if (ppvVar6 == (void **)0x0) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","validate_pattern");
      return -1;
    }
    if ((type->info).str.pat_count != 0) {
      lVar7 = 0;
      uVar9 = 1;
      uVar10 = 0;
      do {
        ppvVar6 = (type->info).str.patterns_pcre;
        iVar3 = lyp_precompile_pattern
                          (ctx,(char *)(*(long *)(((type->info).lref.target)->padding +
                                                 lVar7 + -0x1c) + 1),
                           (pcre **)(ppvVar6 + ((int)uVar9 - 1)),(pcre_extra **)(ppvVar6 + uVar9));
        if (iVar3 != 0) {
          return 1;
        }
        uVar10 = uVar10 + 1;
        lVar7 = lVar7 + 0x38;
        uVar9 = (ulong)((int)uVar9 + 2);
      } while (uVar10 < (type->info).str.pat_count);
    }
  }
  if ((type->info).str.pat_count != 0) {
    uVar8 = 1;
    lVar7 = 0;
    uVar9 = 0;
    do {
      ppvVar6 = (type->info).str.patterns_pcre;
      pvVar1 = ppvVar6[uVar8 - 1];
      pvVar2 = ppvVar6[uVar8];
      sVar5 = strlen(pcVar4);
      iVar3 = pcre_exec(pvVar1,pvVar2,pcVar4,sVar5 & 0xffffffff,0,0,0,0);
      if (iVar3 == 0) {
        if (**(char **)(((type->info).lref.target)->padding + lVar7 + -0x1c) == '\x15')
        goto LAB_00126f01;
      }
      else if (**(char **)(((type->info).lref.target)->padding + lVar7 + -0x1c) == '\x06') {
LAB_00126f01:
        ly_vlog(ctx,LYE_NOCONSTR,LY_VLOG_LYD,node,pcVar4,
                *(long *)(((type->info).lref.target)->padding + lVar7 + -0x1c) + 1);
        pcVar4 = *(char **)(((type->info).lref.target)->padding + lVar7 + 4);
        if (pcVar4 != (char *)0x0) {
          ly_vlog_str(ctx,LY_VLOG_PREV,pcVar4);
        }
        pcVar4 = *(char **)(((type->info).lref.target)->padding + lVar7 + -4);
        if (pcVar4 == (char *)0x0) {
          return 1;
        }
        ly_err_last_set_apptag(ctx,pcVar4);
        return 1;
      }
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x38;
      uVar8 = uVar8 + 2;
    } while (uVar9 < (type->info).str.pat_count);
  }
  return 0;
}

Assistant:

static int
validate_pattern(struct ly_ctx *ctx, const char *val_str, struct lys_type *type, struct lyd_node *node)
{
    int rc;
    unsigned int i;
#ifndef LY_ENABLED_CACHE
    pcre *precomp;
#endif

    assert(ctx && (type->base == LY_TYPE_STRING));

    if (!val_str) {
        val_str = "";
    }

    if (type->der && validate_pattern(ctx, val_str, &type->der->type, node)) {
        return EXIT_FAILURE;
    }

#ifdef LY_ENABLED_CACHE
    /* there is no cache, build it */
    if (!type->info.str.patterns_pcre && type->info.str.pat_count) {
        type->info.str.patterns_pcre = malloc(2 * type->info.str.pat_count * sizeof *type->info.str.patterns_pcre);
        LY_CHECK_ERR_RETURN(!type->info.str.patterns_pcre, LOGMEM(ctx), -1);

        for (i = 0; i < type->info.str.pat_count; ++i) {
            if (lyp_precompile_pattern(ctx, &type->info.str.patterns[i].expr[1],
                                       (pcre**)&type->info.str.patterns_pcre[i * 2],
                                       (pcre_extra**)&type->info.str.patterns_pcre[i * 2 + 1])) {
                return EXIT_FAILURE;
            }
        }
    }
#endif

    for (i = 0; i < type->info.str.pat_count; ++i) {
#ifdef LY_ENABLED_CACHE
        rc = pcre_exec((pcre *)type->info.str.patterns_pcre[2 * i], (pcre_extra *)type->info.str.patterns_pcre[2 * i + 1],
                       val_str, strlen(val_str), 0, 0, NULL, 0);
#else
        if (lyp_check_pattern(ctx, &type->info.str.patterns[i].expr[1], &precomp)) {
            return EXIT_FAILURE;
        }
        rc = pcre_exec(precomp, NULL, val_str, strlen(val_str), 0, 0, NULL, 0);
        free(precomp);
#endif
        if ((rc && type->info.str.patterns[i].expr[0] == 0x06) || (!rc && type->info.str.patterns[i].expr[0] == 0x15)) {
            LOGVAL(ctx, LYE_NOCONSTR, LY_VLOG_LYD, node, val_str, &type->info.str.patterns[i].expr[1]);
            if (type->info.str.patterns[i].emsg) {
                ly_vlog_str(ctx, LY_VLOG_PREV, type->info.str.patterns[i].emsg);
            }
            if (type->info.str.patterns[i].eapptag) {
                ly_err_last_set_apptag(ctx, type->info.str.patterns[i].eapptag);
            }
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}